

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void anon_unknown.dwarf_590f::GetAperiodicity
               (double *coarse_frequency_axis,double *coarse_aperiodicity,
               int number_of_aperiodicities,double *frequency_axis,int fft_size,double *aperiodicity
               )

{
  double dVar1;
  int local_3c;
  int i;
  double *aperiodicity_local;
  int fft_size_local;
  double *frequency_axis_local;
  int number_of_aperiodicities_local;
  double *coarse_aperiodicity_local;
  double *coarse_frequency_axis_local;
  
  interp1(coarse_frequency_axis,coarse_aperiodicity,number_of_aperiodicities + 2,frequency_axis,
          fft_size / 2 + 1,aperiodicity);
  for (local_3c = 0; local_3c <= fft_size / 2; local_3c = local_3c + 1) {
    dVar1 = pow(10.0,aperiodicity[local_3c] / 20.0);
    aperiodicity[local_3c] = dVar1;
  }
  return;
}

Assistant:

static void GetAperiodicity(const double *coarse_frequency_axis,
    const double *coarse_aperiodicity, int number_of_aperiodicities,
    const double *frequency_axis, int fft_size, double *aperiodicity) {
  interp1(coarse_frequency_axis, coarse_aperiodicity,
      number_of_aperiodicities + 2, frequency_axis, fft_size / 2 + 1,
      aperiodicity);
  for (int i = 0; i <= fft_size / 2; ++i)
    aperiodicity[i] = pow(10.0, aperiodicity[i] / 20.0);
}